

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O3

int __thiscall Cmd::editInsert(Cmd *this,State *state,char ch)

{
  ulong uVar1;
  ulong uVar2;
  ssize_t sVar3;
  char local_19;
  
  uVar1 = (state->buf)._M_string_length;
  uVar2 = state->pos;
  if (uVar1 == uVar2) {
    state->pos = uVar1 + 1;
    std::__cxx11::string::insert((ulong)state,uVar1,'\x01');
    if (((this->multiline_mode == false) &&
        ((state->buf)._M_string_length + (this->prompt)._M_string_length < state->cols)) &&
       ((this->hints_handler_).super__Function_base._M_manager == (_Manager_type)0x0)) {
      local_19 = '*';
      if (state->mask_mode == false) {
        local_19 = ch;
      }
      sVar3 = write(this->out_fd_,&local_19,1);
      if (sVar3 != -1) {
        return 0;
      }
      return -1;
    }
  }
  else {
    state->pos = uVar2 + 1;
    std::__cxx11::string::insert((ulong)state,uVar2,'\x01');
  }
  refreshLine(this,state);
  return 0;
}

Assistant:

int editInsert(State *state, char ch) {
		if (state->buf.size() == state->pos) {
			state->buf.insert(state->pos++, 1, ch);

			if (!multiline_mode && prompt.size() + state->buf.size() < state->cols && !hints_handler_) {
				// Avoid a full update of the line in the trivial case.
				const char d = (state->mask_mode) ? '*' : ch;
				if (write_char(d) == -1) {
					return -1;
				}
			} else {
				refreshLine(state);
			}
		} else {
			state->buf.insert(state->pos++, 1, ch);
			refreshLine(state);
		}
		return 0;
	}